

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O2

void compile_gram(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *grams,uint32_t *dest,char *descriptor,bool quiet)

{
  byte bVar1;
  pointer pbVar2;
  uint32_t uVar3;
  size_t j;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  string ngram;
  byte *local_50;
  long local_48;
  
  for (uVar6 = 0;
      pbVar2 = (grams->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(grams->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar6 = uVar6 + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)(pbVar2 + uVar6));
    bVar1 = *local_50;
    if ((int)(char)bVar1 - 0x30U < 10) {
      uVar3 = atoi((char *)local_50);
      if (!quiet) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Generating ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
        poVar4 = std::operator<<(poVar4,"-");
        poVar4 = std::operator<<(poVar4,descriptor);
        poVar4 = std::operator<<(poVar4," for all namespaces.");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
        dest[lVar5] = uVar3;
      }
    }
    else if (local_48 == 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "You must specify the namespace index before the n");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      uVar3 = atoi((char *)(local_50 + 1));
      dest[bVar1] = uVar3;
      if (!quiet) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Generating ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
        poVar4 = std::operator<<(poVar4,"-");
        poVar4 = std::operator<<(poVar4,descriptor);
        poVar4 = std::operator<<(poVar4," for ");
        poVar4 = std::operator<<(poVar4,*local_50);
        poVar4 = std::operator<<(poVar4," namespaces.");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void compile_gram(vector<string> grams, uint32_t* dest, char* descriptor, bool quiet)
{
  for (size_t i = 0; i < grams.size(); i++)
  {
    string ngram = grams[i];
    if (isdigit(ngram[0]))
    {
      int n = atoi(ngram.c_str());
      if (!quiet)
        cerr << "Generating " << n << "-" << descriptor << " for all namespaces." << endl;
      for (size_t j = 0; j < 256; j++) dest[j] = n;
    }
    else if (ngram.size() == 1)
      cout << "You must specify the namespace index before the n" << endl;
    else
    {
      int n = atoi(ngram.c_str() + 1);
      dest[(uint32_t)(unsigned char)*ngram.c_str()] = n;
      if (!quiet)
        cerr << "Generating " << n << "-" << descriptor << " for " << ngram[0] << " namespaces." << endl;
    }
  }
}